

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O1

int VP8Decimate(VP8EncIterator *it,VP8ModeScore *rd,VP8RDLevel rd_opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  byte bVar7;
  ushort uVar8;
  byte *pbVar9;
  VP8Encoder *pVVar10;
  DError *paaiVar11;
  bool bVar12;
  ushort uVar13;
  int iVar14;
  uint32_t uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  uint16_t *puVar22;
  int8_t *piVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  int16_t (*paiVar27) [16];
  ushort uVar28;
  int iVar29;
  uint8_t *puVar30;
  undefined8 *puVar31;
  uint8_t *puVar32;
  long lVar33;
  ushort uVar34;
  uint8_t *puVar35;
  ulong uVar36;
  undefined1 *puVar37;
  uint8_t *puVar38;
  long lVar39;
  uint8_t *puVar40;
  ulong uVar41;
  VP8ModeScore *rd_00;
  VP8ModeScore *pVVar42;
  uint8_t *puVar43;
  uint8_t *puVar44;
  VP8ModeScore *__src;
  long lVar45;
  long lVar46;
  bool bVar47;
  bool bVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  uint32_t v;
  long local_490;
  undefined1 local_468 [16];
  long local_448;
  long lStack_440;
  long local_430;
  long local_3f8;
  long local_3f0;
  long local_3e8;
  ulong local_3e0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  long local_388;
  undefined8 local_360 [64];
  undefined1 local_160 [2];
  short local_15e [139];
  uint local_48;
  int8_t local_44 [3];
  int8_t local_40 [16];
  
  iVar18 = it->enc_->method_;
  rd->nz = 0;
  rd->D = 0;
  rd->SD = 0;
  rd->H = 0;
  rd->R = 0;
  rd->score = 0x7fffffffffffff;
  if (it->x_ == 0) {
    puVar35 = (uint8_t *)0x0;
  }
  else {
    puVar35 = it->y_left_;
  }
  if (it->y_ == 0) {
    puVar30 = (uint8_t *)0x0;
  }
  else {
    puVar30 = it->y_top_;
  }
  (*VP8EncPredLuma16)(it->yuv_p_,puVar35,puVar30);
  if (it->x_ == 0) {
    puVar35 = (uint8_t *)0x0;
  }
  else {
    puVar35 = it->u_left_;
  }
  if (it->y_ == 0) {
    puVar30 = (uint8_t *)0x0;
  }
  else {
    puVar30 = it->uv_top_;
  }
  (*VP8EncPredChroma8)(it->yuv_p_,puVar35,puVar30);
  local_430 = 0x7fffffffffffff;
  if (rd_opt == RD_OPT_NONE) {
    bVar47 = true;
    bVar48 = 1 < iVar18;
    if (iVar18 < 2) {
      bVar47 = ((uint)*it->mb_ & 3) == 1;
    }
    lVar20 = 0x7fffffffffffff;
    if (1 < iVar18) {
      lVar20 = (long)it->enc_->mb_header_limit_;
    }
    local_490 = it->enc_->dqm_[*(byte *)it->mb_ >> 5 & 3].i4_penalty_;
    if (bVar47) {
      pbVar9 = it->yuv_in_;
      iVar26 = -1;
      lVar46 = 0;
      lVar21 = 0x7fffffffffffff;
      do {
        iVar17 = (*VP8SSE16x16)(pbVar9,it->yuv_p_ + VP8I16ModeOffsets[lVar46]);
        local_448 = (ulong)VP8FixedCostsI16[lVar46] * 0x6a + (long)iVar17 * 0x100;
        iVar17 = (int)lVar46;
        if (lVar21 <= local_448) {
          local_448 = lVar21;
          iVar17 = iVar26;
        }
        if (lVar46 != 0 && lVar20 < (long)(ulong)VP8FixedCostsI16[lVar46]) {
          local_448 = lVar21;
          iVar17 = iVar26;
        }
        iVar26 = iVar17;
        lVar46 = lVar46 + 1;
        lVar21 = local_448;
      } while (lVar46 != 4);
      if ((it->x_ == 0) || (it->y_ == 0)) {
        iVar17 = (uint)*pbVar9 * 0x1010101;
        local_3a8._0_4_ = iVar17;
        lVar21 = 0;
        do {
          bVar12 = true;
          if ((((*(int *)(pbVar9 + lVar21) != iVar17) || (*(int *)(pbVar9 + lVar21 + 4) != iVar17))
              || (*(int *)(pbVar9 + lVar21 + 8) != iVar17)) ||
             (*(int *)(pbVar9 + lVar21 + 0xc) != iVar17)) goto LAB_0013da3a;
          lVar21 = lVar21 + 0x20;
        } while ((int)lVar21 != 0x200);
        bVar12 = false;
LAB_0013da3a:
        if (!bVar12) {
          iVar26 = (uint)(it->x_ != 0) * 2;
        }
        bVar48 = bVar12 && bVar48;
      }
      VP8SetIntra16Mode(it,iVar26);
    }
    else {
      local_448 = 0x7fffffffffffff;
    }
    if ((bVar48) || (!bVar47)) {
      VP8IteratorStartI4(it);
      local_468._0_8_ = 0;
      bVar47 = false;
      uVar24 = 0;
      do {
        uVar13 = VP8Scan[it->i4_];
        puVar35 = it->yuv_in_;
        puVar22 = GetCostModeI4(it,rd->modes_i4);
        (*VP8EncPredLuma4)(it->yuv_p_,it->i4_top_);
        uVar41 = 0xffffffff;
        uVar36 = 0;
        lVar21 = 0x7fffffffffffff;
        do {
          iVar26 = (*VP8SSE4x4)(puVar35 + uVar13,it->yuv_p_ + VP8I4ModeOffsets[uVar36]);
          lVar46 = (ulong)puVar22[uVar36] * 0xb + (long)iVar26 * 0x100;
          if (lVar46 < lVar21) {
            uVar41 = uVar36 & 0xffffffff;
          }
          if (lVar21 < lVar46) {
            lVar46 = lVar21;
          }
          uVar36 = uVar36 + 1;
          lVar21 = lVar46;
        } while (uVar36 != 10);
        local_468._0_8_ = local_468._0_8_ + (ulong)puVar22[(int)uVar41];
        rd->modes_i4[it->i4_] = (uint8_t)uVar41;
        local_490 = local_490 + lVar46;
        if (lVar20 < (long)local_468._0_8_ || local_448 <= local_490) {
          bVar47 = true;
          break;
        }
        iVar26 = ReconstructIntra4(it,rd->y_ac_levels[it->i4_],puVar35 + uVar13,
                                   it->yuv_out2_ + VP8Scan[it->i4_],(int)uVar41);
        uVar24 = uVar24 | iVar26 << ((byte)it->i4_ & 0x1f);
        iVar26 = VP8IteratorRotateI4(it,it->yuv_out2_);
      } while (iVar26 != 0);
    }
    else {
      uVar24 = 0;
    }
    if (bVar47) {
      uVar24 = ReconstructIntra16(it,rd,it->yuv_out_,(uint)*it->preds_);
      local_490 = local_448;
    }
    else {
      VP8SetIntra4Mode(it,rd->modes_i4);
      uVar3 = it->yuv_out_;
      uVar6 = it->yuv_out2_;
      auVar51._8_4_ = (int)uVar3;
      auVar51._0_8_ = uVar6;
      auVar51._12_4_ = (int)((ulong)uVar3 >> 0x20);
      it->yuv_out_ = (uint8_t *)uVar6;
      it->yuv_out2_ = (uint8_t *)auVar51._8_8_;
    }
    if (0 < iVar18) {
      puVar35 = it->yuv_in_;
      uVar36 = 0xffffffff;
      uVar41 = 0;
      lVar20 = 0x7fffffffffffff;
      do {
        iVar18 = (*VP8SSE16x8)(puVar35 + 0x10,it->yuv_p_ + VP8UVModeOffsets[uVar41]);
        lVar21 = (ulong)VP8FixedCostsUV[uVar41] * 0x78 + (long)iVar18 * 0x100;
        if (lVar21 < lVar20) {
          uVar36 = uVar41 & 0xffffffff;
        }
        if (lVar21 <= lVar20) {
          lVar20 = lVar21;
        }
        uVar41 = uVar41 + 1;
      } while (uVar41 != 4);
      VP8SetIntraUVMode(it,(int)uVar36);
    }
    uVar19 = ReconstructUV(it,rd,it->yuv_out_ + 0x10,(uint)*it->mb_ >> 2 & 3);
    rd->nz = uVar19 | uVar24;
    rd->score = local_490;
  }
  else {
    it->do_trellis_ = (uint)(RD_OPT_TRELLIS < rd_opt);
    pbVar9 = it->yuv_in_;
    pVVar10 = it->enc_;
    uVar24 = *(byte *)it->mb_ >> 5 & 3;
    iVar26 = pVVar10->dqm_[uVar24].lambda_i16_;
    iVar17 = pVVar10->dqm_[uVar24].tlambda_;
    iVar14 = (uint)*pbVar9 * 0x1010101;
    local_3a8._0_4_ = iVar14;
    bVar48 = false;
    lVar20 = 0;
    do {
      bVar47 = false;
      if (((*(int *)(pbVar9 + lVar20) != iVar14) ||
          (bVar47 = bVar48, *(int *)(pbVar9 + lVar20 + 4) != iVar14)) ||
         ((*(int *)(pbVar9 + lVar20 + 8) != iVar14 || (*(int *)(pbVar9 + lVar20 + 0xc) != iVar14))))
      goto LAB_0013cd20;
      lVar20 = lVar20 + 0x20;
    } while ((int)lVar20 != 0x200);
    bVar47 = true;
LAB_0013cd20:
    rd->mode_i16 = -1;
    lVar20 = 0;
    rd_00 = (VP8ModeScore *)local_3a8;
    __src = rd;
    do {
      puVar35 = it->yuv_out2_;
      rd_00->mode_i16 = (int)lVar20;
      uVar15 = ReconstructIntra16(it,rd_00,puVar35,(int)lVar20);
      rd_00->nz = uVar15;
      iVar14 = (*VP8SSE16x16)(pbVar9,puVar35);
      rd_00->D = (long)iVar14;
      if (iVar17 == 0) {
        lVar21 = 0;
      }
      else {
        iVar14 = (*VP8TDisto16x16)(pbVar9,puVar35,kWeightY);
        lVar21 = (long)(iVar14 * iVar17 + 0x80 >> 8);
      }
      rd_00->SD = lVar21;
      rd_00->H = (ulong)VP8FixedCostsI16[lVar20];
      iVar14 = VP8GetCostLuma16(it,rd_00);
      rd_00->R = (long)iVar14;
      if (bVar47) {
        paiVar27 = rd_00->y_ac_levels;
        iVar29 = 0;
        iVar16 = 0x10;
        do {
          iVar25 = iVar16;
          if (iVar25 == 0) {
            bVar47 = true;
            break;
          }
          bVar47 = false;
          uVar19 = (uint)((*paiVar27)[1] != 0);
          bVar48 = SCARRY4(iVar29,uVar19);
          iVar29 = iVar29 + uVar19;
          if (iVar29 == 0 || bVar48 != iVar29 < 0) {
            uVar41 = 0;
            do {
              if (uVar41 == 0xe) {
                paiVar27 = paiVar27 + 1;
                bVar48 = true;
                goto LAB_0013ce31;
              }
              lVar21 = uVar41 + 2;
              uVar41 = uVar41 + 1;
              uVar19 = (uint)((*paiVar27)[lVar21] != 0);
              bVar48 = SCARRY4(iVar29,uVar19);
              iVar29 = iVar29 + uVar19;
            } while (iVar29 == 0 || bVar48 != iVar29 < 0);
            bVar48 = 0xe < uVar41;
          }
          else {
            bVar48 = false;
          }
LAB_0013ce31:
          iVar16 = iVar25 + -1;
        } while (bVar48);
        if (iVar25 == 0) {
          rd_00->D = rd_00->D * 2;
          rd_00->SD = rd_00->SD * 2;
        }
        else {
          bVar47 = false;
        }
      }
      else {
        bVar47 = false;
      }
      lVar21 = (rd_00->SD + rd_00->D) * 0x100 + ((long)iVar14 + rd_00->H) * (long)iVar26;
      rd_00->score = lVar21;
      if ((lVar20 == 0) || (pVVar42 = rd_00, lVar21 < __src->score)) {
        uVar1 = it->yuv_out_;
        uVar4 = it->yuv_out2_;
        auVar49._8_4_ = (int)uVar1;
        auVar49._0_8_ = uVar4;
        auVar49._12_4_ = (int)((ulong)uVar1 >> 0x20);
        it->yuv_out_ = (uint8_t *)uVar4;
        it->yuv_out2_ = (uint8_t *)auVar49._8_8_;
        pVVar42 = __src;
        __src = rd_00;
      }
      lVar20 = lVar20 + 1;
      rd_00 = pVVar42;
    } while (lVar20 != 4);
    if (__src != rd) {
      memcpy(rd,__src,0x370);
    }
    rd->score = (rd->SD + rd->D) * 0x100 +
                (rd->H + rd->R) * (long)pVVar10->dqm_[uVar24].lambda_mode_;
    VP8SetIntra16Mode(it,rd->mode_i16);
    if (((rd->nz & 0x100ffff) == 0x1000000) && ((long)pVVar10->dqm_[uVar24].min_disto_ < rd->D)) {
      uVar13 = rd->y_dc_levels[1];
      uVar8 = rd->y_dc_levels[2];
      uVar28 = -uVar13;
      if (0 < (short)uVar13) {
        uVar28 = uVar13;
      }
      uVar13 = -uVar8;
      if (0 < (short)uVar8) {
        uVar13 = uVar8;
      }
      uVar8 = rd->y_dc_levels[4];
      uVar34 = -uVar8;
      if (0 < (short)uVar8) {
        uVar34 = uVar8;
      }
      if (uVar28 < uVar13) {
        uVar28 = uVar13;
      }
      if (uVar34 <= uVar28) {
        uVar34 = uVar28;
      }
      if (pVVar10->dqm_[uVar24].max_edge_ < (int)(uint)uVar34) {
        pVVar10->dqm_[uVar24].max_edge_ = (uint)uVar34;
      }
    }
    if ((1 < iVar18) && (pVVar10 = it->enc_, pVVar10->max_i4_header_bits_ != 0)) {
      uVar24 = *(byte *)it->mb_ >> 5 & 3;
      lVar20 = (long)pVVar10->dqm_[uVar24].lambda_i4_;
      iVar18 = pVVar10->dqm_[uVar24].tlambda_;
      puVar30 = it->yuv_in_;
      puVar44 = it->yuv_out2_;
      local_48 = 0;
      local_3a8 = (undefined1  [16])0x0;
      local_398 = ZEXT816(0xd3);
      local_388 = (long)pVVar10->dqm_[uVar24].lambda_mode_ * 0xd3;
      VP8IteratorStartI4(it);
      puVar35 = rd->modes_i4;
      iVar26 = 0;
      do {
        uVar13 = VP8Scan[it->i4_];
        puVar32 = puVar30 + uVar13;
        puVar22 = GetCostModeI4(it,puVar35);
        puVar43 = it->yuv_p_ + 0x688;
        (*VP8EncPredLuma4)(it->yuv_p_,it->i4_top_);
        local_490._0_4_ = -1;
        lVar46 = 0;
        local_3f0 = 0;
        local_3e8 = 0;
        local_3e0 = 0;
        uVar19 = 0;
        lVar21 = 0x7fffffffffffff;
        local_3f8 = 0;
        puVar38 = puVar44 + uVar13;
        do {
          iVar14 = ReconstructIntra4(it,(int16_t *)&local_3c8,puVar32,puVar43,(int)lVar46);
          iVar17 = it->i4_;
          iVar16 = (*VP8SSE4x4)(puVar32,puVar43);
          if (iVar18 == 0) {
            lVar39 = 0;
          }
          else {
            iVar29 = (*VP8TDisto4x4)(puVar32,puVar43,kWeightY);
            lVar39 = (long)(iVar29 * iVar18 + 0x80 >> 8);
          }
          uVar41 = (ulong)puVar22[lVar46];
          if (lVar46 != 0) {
            iVar29 = 0;
            iVar25 = 1;
            puVar31 = &local_3c8;
            do {
              bVar48 = iVar25 == 0;
              iVar25 = iVar25 + -1;
              if (bVar48) {
                lVar45 = 0x8c;
                goto LAB_0013d1e2;
              }
              iVar29 = (iVar29 + 1) - (uint)(*(short *)((long)puVar31 + 2) == 0);
              if (iVar29 < 4) {
                uVar36 = 0;
                do {
                  if (uVar36 == 0xe) {
                    puVar31 = puVar31 + 4;
                    bVar48 = true;
                    goto LAB_0013d1d2;
                  }
                  iVar29 = (iVar29 + 1) - (uint)(*(short *)((long)puVar31 + uVar36 * 2 + 4) == 0);
                  uVar36 = uVar36 + 1;
                } while (iVar29 < 4);
                bVar48 = 0xe < uVar36;
              }
              else {
                bVar48 = false;
              }
LAB_0013d1d2:
            } while (bVar48);
          }
          lVar45 = 0;
LAB_0013d1e2:
          lVar33 = (lVar39 + iVar16) * 0x100;
          puVar40 = puVar38;
          if (((int)local_490 < 0) || ((long)((lVar45 + uVar41) * lVar20 + lVar33) < lVar21)) {
            iVar29 = VP8GetCostLuma4(it,(int16_t *)&local_3c8);
            lVar33 = (lVar45 + iVar29 + uVar41) * lVar20 + lVar33;
            if (((int)local_490 < 0) || (lVar33 < lVar21)) {
              lVar21 = (long)it->i4_;
              local_360[lVar21 * 4 + 2] = local_3b8;
              local_360[lVar21 * 4 + 3] = uStack_3b0;
              local_360[lVar21 * 4] = local_3c8;
              local_360[lVar21 * 4 + 1] = uStack_3c0;
              lVar21 = lVar33;
              puVar40 = puVar43;
              puVar43 = puVar38;
              local_3f8 = lVar45 + iVar29;
              local_3f0 = (long)iVar16;
              local_3e8 = lVar39;
              local_3e0 = uVar41;
              local_490._0_4_ = (int)lVar46;
              uVar19 = iVar14 << ((byte)iVar17 & 0x1f);
            }
          }
          lVar46 = lVar46 + 1;
          puVar38 = puVar40;
        } while (lVar46 != 10);
        local_3a8._8_8_ = local_3a8._8_8_ + local_3e8;
        local_3a8._0_8_ = local_3a8._0_8_ + local_3f0;
        local_398._8_8_ = local_398._8_8_ + local_3f8;
        local_398._0_8_ = local_398._0_8_ + local_3e0;
        local_48 = local_48 | uVar19;
        local_388 = (local_3f0 + local_3e8) * 0x100 +
                    (local_3e0 + local_3f8) * (long)pVVar10->dqm_[uVar24].lambda_mode_ + local_388;
        if (local_388 < rd->score) {
          iVar26 = iVar26 + (int)local_3e0;
          if (pVVar10->max_i4_header_bits_ < iVar26) {
            bVar48 = false;
          }
          else {
            if (puVar40 != puVar44 + VP8Scan[it->i4_]) {
              (*VP8Copy4x4)(puVar40,puVar44 + VP8Scan[it->i4_]);
            }
            puVar35[it->i4_] = (uint8_t)(int)local_490;
            it->left_nz_[it->i4_ >> 2] = (uint)(uVar19 != 0);
            it->top_nz_[it->i4_ & 3] = (uint)(uVar19 != 0);
            bVar48 = true;
          }
        }
        else {
          bVar48 = false;
        }
        if (!bVar48) goto LAB_0013d49e;
        iVar17 = VP8IteratorRotateI4(it,puVar44);
      } while (iVar17 != 0);
      rd->D = local_3a8._0_8_;
      rd->SD = local_3a8._8_8_;
      rd->H = local_398._0_8_;
      rd->R = local_398._8_8_;
      rd->nz = local_48;
      rd->score = local_388;
      VP8SetIntra4Mode(it,puVar35);
      uVar2 = it->yuv_out_;
      uVar5 = it->yuv_out2_;
      auVar50._8_4_ = (int)uVar2;
      auVar50._0_8_ = uVar5;
      auVar50._12_4_ = (int)((ulong)uVar2 >> 0x20);
      it->yuv_out_ = (uint8_t *)uVar5;
      it->yuv_out2_ = (uint8_t *)auVar50._8_8_;
      memcpy(rd->y_ac_levels,local_360,0x200);
    }
LAB_0013d49e:
    iVar18 = it->enc_->dqm_[*(byte *)it->mb_ >> 5 & 3].lambda_uv_;
    puVar35 = it->yuv_in_;
    puVar30 = it->yuv_out2_;
    puVar43 = it->yuv_out_ + 0x10;
    rd->mode_uv = -1;
    local_448 = 0;
    lStack_440 = 0;
    lVar20 = 0;
    uVar24 = 0;
    local_468 = (undefined1  [16])0x0;
    puVar30 = puVar30 + 0x10;
    puVar44 = puVar43;
    do {
      local_48 = ReconstructUV(it,(VP8ModeScore *)local_3a8,puVar30,(int)lVar20);
      iVar26 = (*VP8SSE16x8)(puVar35 + 0x10,puVar30);
      auVar51 = local_398;
      local_3a8._8_8_ = 0;
      local_3a8._0_8_ = (long)iVar26;
      local_398._2_6_ = 0;
      local_398._0_2_ = VP8FixedCostsUV[lVar20];
      local_398._8_8_ = auVar51._8_8_;
      iVar26 = VP8GetCostUV(it,(VP8ModeScore *)local_3a8);
      uVar19 = local_48;
      local_398._8_8_ = (long)iVar26;
      if (lVar20 != 0) {
        iVar17 = 0;
        iVar14 = 8;
        puVar37 = local_160;
        do {
          bVar48 = iVar14 == 0;
          iVar14 = iVar14 + -1;
          if (bVar48) {
            local_398._8_8_ = (long)iVar26 + 0x460;
            break;
          }
          iVar17 = (iVar17 + 1) - (uint)(*(short *)(puVar37 + 2) == 0);
          if (iVar17 < 3) {
            uVar41 = 0;
            do {
              if (uVar41 == 0xe) {
                puVar37 = puVar37 + 0x20;
                bVar48 = true;
                goto LAB_0013d600;
              }
              iVar17 = (iVar17 + 1) - (uint)(*(short *)(puVar37 + uVar41 * 2 + 4) == 0);
              uVar41 = uVar41 + 1;
            } while (iVar17 < 3);
            bVar48 = 0xe < uVar41;
          }
          else {
            bVar48 = false;
          }
LAB_0013d600:
        } while (bVar48);
      }
      lVar21 = (local_3a8._8_8_ + local_3a8._0_8_) * 0x100 +
               (local_398._8_8_ + local_398._0_8_) * (long)iVar18;
      local_388 = lVar21;
      if ((lVar20 == 0) || (puVar32 = puVar30, lVar21 < local_430)) {
        local_448 = local_3a8._0_8_;
        lStack_440 = local_3a8._8_8_;
        local_468 = local_398;
        rd->mode_uv = (int)lVar20;
        memcpy(rd->uv_levels,local_160,0x100);
        puVar32 = puVar44;
        puVar44 = puVar30;
        local_430 = lVar21;
        uVar24 = uVar19;
        if (it->top_derr_ != (DError *)0x0) {
          *(undefined2 *)(rd->derr[1] + 1) = local_40._0_2_;
          *(undefined4 *)rd->derr = _local_44;
        }
      }
      lVar20 = lVar20 + 1;
      puVar30 = puVar32;
    } while (lVar20 != 4);
    VP8SetIntraUVMode(it,rd->mode_uv);
    rd->D = rd->D + local_448;
    rd->SD = rd->SD + lStack_440;
    rd->H = rd->H + local_468._0_8_;
    rd->R = rd->R + local_468._8_8_;
    rd->nz = rd->nz | uVar24;
    rd->score = rd->score + local_430;
    if (puVar44 != puVar43) {
      (*VP8Copy16x8)(puVar44,puVar43);
    }
    if (it->top_derr_ != (DError *)0x0) {
      piVar23 = rd->derr[0] + 2;
      lVar20 = 0x159;
      do {
        iVar18 = it->x_;
        paaiVar11 = it->top_derr_;
        it->i4_boundary_[lVar20 + -0x51] = (*(int8_t (*) [3])(piVar23 + -2))[0];
        it->i4_boundary_[lVar20 + -0x50] = (uint8_t)((uint)(*piVar23 * 3) >> 2);
        paaiVar11[(long)iVar18 + -0x57][1][lVar20 + 1] = piVar23[-1];
        paaiVar11[(long)iVar18 + -0x56][0][lVar20] = *piVar23 - it->i4_boundary_[lVar20 + -0x50];
        lVar20 = lVar20 + 2;
        piVar23 = piVar23 + 3;
      } while (lVar20 == 0x15b);
    }
    if (rd_opt == RD_OPT_TRELLIS) {
      it->do_trellis_ = 1;
      if (((uint)*it->mb_ & 3) == 1) {
        uVar24 = ReconstructIntra16(it,rd,it->yuv_out_,(uint)*it->preds_);
      }
      else {
        pVVar10 = it->enc_;
        VP8IteratorStartI4(it);
        uVar24 = 0;
        do {
          uVar19 = it->i4_;
          uVar13 = VP8Scan[(int)uVar19];
          bVar7 = it->preds_[(int)(((int)uVar19 >> 2) * pVVar10->preds_w_ + (uVar19 & 3))];
          puVar35 = it->yuv_in_;
          puVar30 = it->yuv_out_;
          (*VP8EncPredLuma4)(it->yuv_p_,it->i4_top_);
          iVar18 = ReconstructIntra4(it,rd->y_ac_levels[it->i4_],puVar35 + uVar13,puVar30 + uVar13,
                                     (uint)bVar7);
          uVar24 = uVar24 | iVar18 << ((byte)it->i4_ & 0x1f);
          iVar18 = VP8IteratorRotateI4(it,it->yuv_out_);
        } while (iVar18 != 0);
      }
      uVar19 = ReconstructUV(it,rd,it->yuv_out_ + 0x10,(uint)*it->mb_ >> 2 & 3);
      rd->nz = uVar19 | uVar24;
    }
  }
  uVar24 = (uint)(rd->nz == 0);
  VP8SetSkip(it,uVar24);
  return uVar24;
}

Assistant:

int VP8Decimate(VP8EncIterator* const it, VP8ModeScore* const rd,
                VP8RDLevel rd_opt) {
  int is_skipped;
  const int method = it->enc_->method_;

  InitScore(rd);

  // We can perform predictions for Luma16x16 and Chroma8x8 already.
  // Luma4x4 predictions needs to be done as-we-go.
  VP8MakeLuma16Preds(it);
  VP8MakeChroma8Preds(it);

  if (rd_opt > RD_OPT_NONE) {
    it->do_trellis_ = (rd_opt >= RD_OPT_TRELLIS_ALL);
    PickBestIntra16(it, rd);
    if (method >= 2) {
      PickBestIntra4(it, rd);
    }
    PickBestUV(it, rd);
    if (rd_opt == RD_OPT_TRELLIS) {   // finish off with trellis-optim now
      it->do_trellis_ = 1;
      SimpleQuantize(it, rd);
    }
  } else {
    // At this point we have heuristically decided intra16 / intra4.
    // For method >= 2, pick the best intra4/intra16 based on SSE (~tad slower).
    // For method <= 1, we don't re-examine the decision but just go ahead with
    // quantization/reconstruction.
    RefineUsingDistortion(it, (method >= 2), (method >= 1), rd);
  }
  is_skipped = (rd->nz == 0);
  VP8SetSkip(it, is_skipped);
  return is_skipped;
}